

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitPropLoad
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool skipUseBeforeDeclarationCheck)

{
  ByteCodeWriter *this_00;
  Scope *symScope;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ProfileId profileId;
  OpCode OVar4;
  PropertyId PVar5;
  uint uVar6;
  RegSlot RVar7;
  ByteCodeLabel BVar8;
  Scope **ppSVar9;
  undefined4 *puVar10;
  Scope *scope;
  ParseNodeVar *pPVar11;
  Type *pTVar12;
  uint32 slotId;
  FuncInfo *this_01;
  int i;
  int iVar13;
  DynamicLoadKind scopeLocation;
  undefined1 local_b0 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  undefined1 local_70 [8];
  DynamicLoadRecord rec;
  PropertyId envIndex;
  
  rec.label = -1;
  ppSVar9 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar9 = &this->globalScope;
  }
  symScope = *ppSVar9;
  recList._40_8_ = pid;
  unique0x100009a5 = sym;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x13b4,"(symScope)","symScope");
    if (!bVar2) goto LAB_00811ac5;
    *puVar10 = 0;
  }
  if ((stack0xffffffffffffffa0 != (Symbol *)0x0) &&
     ((stack0xffffffffffffffa0->field_0x43 & 0x40) != 0)) {
    EmitModuleExportAccess(this,stack0xffffffffffffffa0,LdModuleSlot,lhsLocation,funcInfo);
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       this->alloc;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  this_00 = &this->m_writer;
  scopeLocation = ~Invalid;
  scope = (Scope *)0x0;
  while ((scope = FindScopeForSym(this,symScope,scope,&rec.label,funcInfo),
         scope != this->globalScope && (scopeLocation = scope->location, scope != symScope))) {
    if ((scope->field_0x44 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x13ce,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar2) goto LAB_00811ac5;
      *puVar10 = 0;
    }
    if ((scope->field_0x44 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x13cf,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) goto LAB_00811ac5;
      *puVar10 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)local_70);
    local_70._4_4_ = Js::ByteCodeWriter::DefineLabel(this_00);
    if (stack0xffffffffffffffa0 == (Symbol *)0x0) {
      PVar5 = *(PropertyId *)(recList._40_8_ + 0x1c);
    }
    else {
      PVar5 = Symbol::EnsurePosition(stack0xffffffffffffffa0,this);
    }
    uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
    BVar8 = rec.label;
    if (scope->scopeType == ScopeType_With) {
      if (rec.label == -1) {
        Js::ByteCodeWriter::BrProperty(this_00,BrOnHasProperty,local_70._4_4_,scopeLocation,uVar6);
        local_70._0_4_ = LocalWith;
        rec.kind = scopeLocation;
      }
      else {
        Js::ByteCodeWriter::BrEnvProperty
                  (this_00,BrOnHasEnvProperty,local_70._4_4_,uVar6,rec.label + 1);
        local_70._0_4_ = EnvWith;
LAB_00811318:
        rec.kind = BVar8 + Local;
      }
    }
    else {
      if (rec.label != -1) {
        Js::ByteCodeWriter::BrEnvProperty
                  (this_00,BrOnHasLocalEnvProperty,local_70._4_4_,uVar6,rec.label + 1);
        local_70._0_4_ = Env;
        goto LAB_00811318;
      }
      Js::ByteCodeWriter::BrLocalProperty(this_00,BrOnHasLocalProperty,local_70._4_4_,uVar6);
      local_70._0_4_ = Local;
      rec.kind = scopeLocation;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_b0,0);
    *(DynamicLoadKind *)
     ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
            _vptr_ReadOnlyList +
     (long)(int)recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                buffer * 0xc + 8) = rec.kind;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(local_70._4_4_,local_70._0_4_);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  }
  if (stack0xffffffffffffffa0 == (Symbol *)0x0) {
LAB_00811518:
    iVar13 = *(int *)(recList._40_8_ + 0x1c);
LAB_0081151f:
    if ((this->flags >> 10 & 1) == 0) {
      if ((this->flags & 4) == 0) {
        OVar4 = LdRootFld;
        bVar2 = true;
        if (iVar13 < 0x186) {
          if (iVar13 == 0xba) {
            OVar4 = LdInfinity;
            goto LAB_008116c5;
          }
          if (iVar13 == 0x105) {
            OVar4 = LdNaN;
            goto LAB_008116c5;
          }
        }
        else {
          if (iVar13 == 0x186) {
            OVar4 = LdUndef;
          }
          else {
            if ((iVar13 != 0x27a) || ((DAT_015b01f5 == '\0' && (DAT_015b01f6 != '\x01'))))
            goto LAB_008116c7;
            OVar4 = LdChakraLib;
          }
LAB_008116c5:
          bVar2 = false;
        }
LAB_008116c7:
        if (bVar2) {
          uVar6 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,iVar13,false,false);
          Js::ByteCodeWriter::PatchableRootProperty
                    (this_00,LdRootFld,lhsLocation,uVar6,false,false,true);
        }
        else {
          Js::ByteCodeWriter::Reg1(this_00,OVar4,lhsLocation);
        }
      }
      else {
        RVar7 = FuncInfo::GetEnvRegister(funcInfo);
        uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,iVar13,false,false);
        Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,lhsLocation,uVar6,false,true);
      }
    }
    else if ((((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
            (bVar2 = FuncInfo::IsGlobalFunction(funcInfo), !bVar2)) {
      RVar7 = FuncInfo::GetEnvRegister(funcInfo);
      uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,iVar13,false,false);
      Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,lhsLocation,uVar6,false,true);
    }
    else {
      uVar6 = FuncInfo::FindOrAddInlineCacheId
                        (funcInfo,funcInfo->frameDisplayRegister,iVar13,false,false);
      Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,lhsLocation,uVar6,false,true);
    }
  }
  else {
    if (((stack0xffffffffffffffa0->field_0x42 & 1) == 0) ||
       (scope->func != funcInfo || skipUseBeforeDeclarationCheck)) {
      if (stack0xffffffffffffffa0 == (Symbol *)0x0) goto LAB_00811518;
      if ((stack0xffffffffffffffa0->field_0x42 & 8) == 0) {
        bVar2 = Symbol::IsInSlot(stack0xffffffffffffffa0,this,funcInfo,false);
        if (!bVar2 && rec.label == -1) {
          if (stack0xffffffffffffffa0->location != lhsLocation) {
            Js::ByteCodeWriter::Reg2(this_00,Ld_A,lhsLocation,stack0xffffffffffffffa0->location);
          }
          if ((((stack0xffffffffffffffa0->field_0x42 & 2) != 0) &&
              ((stack0xffffffffffffffa0->decl->nop & ~knopName) == knopConstDecl)) &&
             (pPVar11 = ParseNode::AsParseNodeVar(stack0xffffffffffffffa0->decl),
             pPVar11->isSwitchStmtDecl != '\0')) {
            Js::ByteCodeWriter::Reg1(this_00,ChkUndecl,lhsLocation);
          }
          goto LAB_0081170a;
        }
        PVar5 = Symbol::EnsureScopeSlot(stack0xffffffffffffffa0,this,funcInfo);
        this_01 = funcInfo;
        profileId = FuncInfo::FindOrAddSlotProfileId(funcInfo,scope,PVar5);
        bVar2 = NeedCheckBlockVar((ByteCodeGenerator *)this_01,stack0xffffffffffffffa0,scope,
                                  funcInfo);
        OVar4 = GetLdSlotOp((ByteCodeGenerator *)this_01,scope,rec.label,scopeLocation,funcInfo);
        slotId = PVar5 + (~*(uint *)&stack0xffffffffffffffa0->scope->field_0x44 & 2);
        if (rec.label == -1) {
          if ((scopeLocation == ~Invalid) ||
             ((scopeLocation != funcInfo->frameSlotsRegister &&
              (scopeLocation != funcInfo->frameObjRegister)))) {
            uVar6 = scope->innerScopeIndex;
            if (uVar6 != 0xffffffff) goto LAB_00811464;
            if ((scope->field_0x44 & 2) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x146d,"(scope->GetIsObject())","scope->GetIsObject()");
              if (!bVar3) {
LAB_00811ac5:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar10 = 0;
            }
            Js::ByteCodeWriter::Slot(this_00,OVar4,lhsLocation,scopeLocation,slotId,profileId);
          }
          else {
            Js::ByteCodeWriter::SlotI1(this_00,OVar4,lhsLocation,slotId,profileId);
          }
        }
        else {
          uVar6 = rec.label + 1;
LAB_00811464:
          Js::ByteCodeWriter::SlotI2(this_00,OVar4,lhsLocation,uVar6,slotId,profileId);
        }
        if (bVar2) {
          Js::ByteCodeWriter::Reg1(this_00,ChkUndecl,lhsLocation);
        }
        goto LAB_0081170a;
      }
      if (stack0xffffffffffffffa0 == (Symbol *)0x0) goto LAB_00811518;
      iVar13 = Symbol::EnsurePosition(stack0xffffffffffffffa0,this);
      goto LAB_0081151f;
    }
    bVar2 = Symbol::IsInSlot(stack0xffffffffffffffa0,this,funcInfo,false);
    if (bVar2) {
      PVar5 = Symbol::EnsureScopeSlot(stack0xffffffffffffffa0,this,funcInfo);
      FuncInfo::FindOrAddSlotProfileId(funcInfo,scope,PVar5);
    }
    EmitUseBeforeDeclarationRuntimeError(this,lhsLocation);
  }
LAB_0081170a:
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer != 0) {
    BVar8 = Js::ByteCodeWriter::DefineLabel(this_00);
    Js::ByteCodeWriter::Br(this_00,BVar8);
    iVar13 = 0;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (stack0xffffffffffffffa0 == (Symbol *)0x0) {
        PVar5 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar5 = Symbol::EnsurePosition(stack0xffffffffffffffa0,this);
      }
      pTVar12 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,iVar13);
      Js::ByteCodeWriter::MarkLabel(this_00,pTVar12->label);
      pTVar12 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,iVar13);
      switch(pTVar12->kind) {
      case Local:
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar13);
        uVar6 = FuncInfo::FindOrAddInlineCacheId
                          (funcInfo,(pTVar12->field_2).instance,PVar5,false,false);
        Js::ByteCodeWriter::ElementP(this_00,LdLocalFld_ReuseLoc,lhsLocation,uVar6,false,true);
        goto LAB_00811976;
      case Env:
        RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar13);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar7,(pTVar12->field_2).index);
        uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,PVar5,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,lhsLocation,RVar7,uVar6,false,true);
        break;
      case LocalWith:
        RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar13);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar7,(pTVar12->field_2).instance);
        uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,PVar5,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,lhsLocation,RVar7,uVar6,false,true);
        break;
      case EnvWith:
        RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar13);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar7,(pTVar12->field_2).index);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar7,RVar7);
        uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,PVar5,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,lhsLocation,RVar7,uVar6,false,true);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x14af,"((0))","(0)");
        if (bVar2) {
          *puVar10 = 0;
          goto LAB_00811976;
        }
        goto LAB_00811ac5;
      }
      FuncInfo::ReleaseTmpRegister(funcInfo,RVar7);
LAB_00811976:
      if (iVar13 == (int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer + -1) goto LAB_00811997;
      Js::ByteCodeWriter::Br(this_00,BVar8);
      iVar13 = iVar13 + 1;
    } while( true );
  }
LAB_008119a3:
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
  if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_
               ,recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                _vptr_ReadOnlyList,
               (long)(int)recList.
                          super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                          .alloc * 0xc);
  }
  return;
LAB_00811997:
  Js::ByteCodeWriter::MarkLabel(this_00,BVar8);
  goto LAB_008119a3;
}

Assistant:

void ByteCodeGenerator::EmitPropLoad(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool skipUseBeforeDeclarationCheck)
{
    // If sym belongs to a parent frame, get it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just copy the value to the lhsLocation.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, lhsLocation, funcInfo);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        scopeLocation = scope->GetLocation();

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo && !skipUseBeforeDeclarationCheck)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        if (skipUseBeforeDeclarationCheck)
        {
            if (lhsLocation != Js::Constants::NoRegister)
            {
                this->m_writer.Reg1(Js::OpCode::InitUndecl, lhsLocation);
            }
        }
        else
        {
            EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
        }
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, false);
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

                // Load of a symbol with unknown scope from within eval
                // Get it from the closure environment.
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

            // Load of a symbol with unknown scope from within event handler.
            // Get it from the closure environment.
            this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
        }
        else
        {
            // Special case non-writable built-ins
            // TODO: support non-writable global property in general by detecting what attribute the property have current?
            // But can't be done if we are byte code serialized, because the attribute might be different for use fields
            // next time we run. May want to catch that in the JIT.
            Js::OpCode opcode = Js::OpCode::LdRootFld;

            // These properties are non-writable
            switch (propertyId)
            {
            case Js::PropertyIds::NaN:
                opcode = Js::OpCode::LdNaN;
                break;
            case Js::PropertyIds::Infinity:
                opcode = Js::OpCode::LdInfinity;
                break;
            case Js::PropertyIds::undefined:
                opcode = Js::OpCode::LdUndef;
                break;
            case Js::PropertyIds::__chakraLibrary:
                if (CONFIG_FLAG(LdChakraLib) || CONFIG_FLAG(TestChakraLib))
                {
                    opcode = Js::OpCode::LdChakraLib;
                }
                break;
            }

            if (opcode == Js::OpCode::LdRootFld)
            {
                this->EmitPatchableRootProperty(Js::OpCode::LdRootFld, lhsLocation, propertyId, false, false, funcInfo);
            }
            else
            {
                this->Writer()->Reg1(opcode, lhsLocation);
            }
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        // Now get the property from its slot.
        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, lhsLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, lhsLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, lhsLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, lhsLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }
    else
    {
        if (lhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, lhsLocation, sym->GetLocation());
        }
        if (sym->GetIsBlockVar() && ((sym->GetDecl()->nop == knopLetDecl || sym->GetDecl()->nop == knopConstDecl) && sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl))
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, false);
                    this->m_writer.ElementP(Js::OpCode::LdLocalFld_ReuseLoc, lhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

}